

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O3

char * addbrackets(char *string)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (string != (char *)0x0) {
    sVar1 = strlen(string);
    if ((*string == '[') && (string[sVar1 - 1] == ']')) {
      pcVar2 = strdup(string);
      return pcVar2;
    }
    pcVar2 = (char *)malloc(sVar1 + 3);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '[';
      pcVar3 = stpcpy(pcVar2 + 1,string);
      pcVar3[0] = ']';
      pcVar3[1] = '\0';
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *addbrackets(const char *string) {
  if (string == NULL)
    return NULL;
  size_t length = strlen(string);
  if (!(*string == '[' && string[length - 1] == ']')) {
    char *buffer = malloc(length + 3);
    if (buffer == NULL)
      return NULL;
    char *cp = buffer;
    *cp++ = '[';
    cp = stpcpy (cp, string);
    *cp++ = ']';
    *cp = '\0';
    return buffer;
  }
  return strdup(string);
}